

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PreAndPostIncOperatorCheck::throwIfVariableFound
          (PreAndPostIncOperatorCheck *this,VariableList *list,VariableRef *v)

{
  pool_ref<soul::AST::VariableDeclaration> *ppVar1;
  CompileMessage CStack_48;
  
  ppVar1 = std::
           __find_if<soul::pool_ref<soul::AST::VariableDeclaration>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::pool_ref<soul::AST::VariableDeclaration>const>>
                     (list->items,list->items + list->numActive,&v->variable);
  if (ppVar1 == list->items + list->numActive) {
    return;
  }
  CompileMessageHelpers::createMessage<>
            (&CStack_48,syntax,error,
             "Variables which have the ++ or -- operator applied can not be used twice within the same statement"
            );
  AST::Context::throwError
            (&(v->super_Expression).super_Statement.super_ASTObject.context,&CStack_48,false);
}

Assistant:

void throwIfVariableFound (VariableList& list, AST::VariableRef& v)
        {
            if (contains (list, v.variable))
                v.context.throwError (Errors::preIncDecCollision());
        }